

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

void __thiscall ADynamicLight::LinkLight(ADynamicLight *this)

{
  double dVar1;
  FLightNode **ppFVar2;
  subsector_t *subSec;
  FLightNode *pFVar3;
  DVector3 local_48;
  
  ppFVar2 = &this->touching_sides;
  while (pFVar3 = *ppFVar2, pFVar3 != (FLightNode *)0x0) {
    pFVar3->lightsource = (ADynamicLight *)0x0;
    ppFVar2 = &pFVar3->nextTarget;
  }
  ppFVar2 = &this->touching_subsectors;
  while (pFVar3 = *ppFVar2, pFVar3 != (FLightNode *)0x0) {
    pFVar3->lightsource = (ADynamicLight *)0x0;
    ppFVar2 = &pFVar3->nextTarget;
  }
  ppFVar2 = &this->touching_sector;
  while (pFVar3 = *ppFVar2, pFVar3 != (FLightNode *)0x0) {
    pFVar3->lightsource = (ADynamicLight *)0x0;
    ppFVar2 = &pFVar3->nextTarget;
  }
  if (0.0 < (this->super_AActor).radius) {
    local_48.X = (this->super_AActor).__Pos.X;
    local_48.Y = (this->super_AActor).__Pos.Y;
    subSec = R_PointInSubsector((DVector2 *)&local_48);
    validcount = validcount + 1;
    local_48.X = (this->super_AActor).__Pos.X;
    local_48.Y = (this->super_AActor).__Pos.Y;
    local_48.Z = (this->super_AActor).__Pos.Z;
    dVar1 = (this->super_AActor).radius;
    CollectWithinRadius(this,&local_48,subSec,(float)(dVar1 * dVar1));
  }
  pFVar3 = this->touching_sides;
  while (pFVar3 != (FLightNode *)0x0) {
    if (pFVar3->lightsource == (ADynamicLight *)0x0) {
      pFVar3 = DeleteLightNode(pFVar3);
    }
    else {
      pFVar3 = pFVar3->nextTarget;
    }
  }
  pFVar3 = this->touching_subsectors;
  while (pFVar3 != (FLightNode *)0x0) {
    if (pFVar3->lightsource == (ADynamicLight *)0x0) {
      pFVar3 = DeleteLightNode(pFVar3);
    }
    else {
      pFVar3 = pFVar3->nextTarget;
    }
  }
  pFVar3 = this->touching_sector;
  while (pFVar3 != (FLightNode *)0x0) {
    if (pFVar3->lightsource == (ADynamicLight *)0x0) {
      pFVar3 = DeleteLightNode(pFVar3);
    }
    else {
      pFVar3 = pFVar3->nextTarget;
    }
  }
  return;
}

Assistant:

void ADynamicLight::LinkLight()
{
	// mark the old light nodes
	FLightNode * node;
	
	node = touching_sides;
	while (node)
    {
		node->lightsource = NULL;
		node = node->nextTarget;
    }
	node = touching_subsectors;
	while (node)
    {
		node->lightsource = NULL;
		node = node->nextTarget;
    }
	node = touching_sector;
	while (node)
	{
		node->lightsource = NULL;
		node = node->nextTarget;
	}

	if (radius>0)
	{
		// passing in radius*radius allows us to do a distance check without any calls to sqrt
		subsector_t * subSec = R_PointInSubsector(Pos());
		::validcount++;
		CollectWithinRadius(Pos(), subSec, radius*radius);

	}
		
	// Now delete any nodes that won't be used. These are the ones where
	// m_thing is still NULL.
	
	node = touching_sides;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}

	node = touching_subsectors;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}

	node = touching_sector;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}
}